

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::TryDecimalStringCast<long,(char)46>
               (char *string_ptr,idx_t string_size,long *result,uint8_t width,uint8_t scale)

{
  byte bVar1;
  undefined4 uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  idx_t iVar10;
  char *pcVar11;
  char *buf;
  int iVar12;
  uint uVar13;
  byte bVar14;
  byte bVar15;
  ulong uVar16;
  bool bVar17;
  ExponentData exponent;
  IntegerCastData<short> local_5c;
  bool local_59;
  DecimalCastData<long> local_58;
  ulong local_40;
  ulong local_38;
  
  local_58.result = 0;
  local_58.digit_count = '\0';
  local_58.decimal_count = '\0';
  local_58.round_set = false;
  local_58.should_round = false;
  uVar2 = local_58._10_4_;
  local_58.excessive_decimals = '\0';
  local_58.exponent_type = NONE;
  local_58.limit =
       *(StoreType_conflict1 *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000009,width) & 0xffffffff) * 8);
  if (string_size != 0) {
    uVar9 = 0;
    do {
      bVar15 = string_ptr[uVar9];
      if ((4 < bVar15 - 9) && (bVar15 != 0x20)) {
        local_58.digit_count = 0;
        local_58.decimal_count = 0;
        bVar14 = local_58.decimal_count;
        local_58.round_set = false;
        bVar3 = local_58.round_set;
        local_58.width = width;
        local_58.scale = scale;
        if (bVar15 == 0x2d) {
          local_58.result = 0;
          uVar6 = string_size - uVar9;
          uVar4 = 1;
          goto LAB_0151b9ed;
        }
        if (bVar15 == 0x30 && string_size - 1 != uVar9) {
          bVar1 = string_ptr[uVar9 + 1];
          if (bVar1 < 0x62) {
            if ((bVar1 == 0x42) || (bVar1 == 0x58)) {
LAB_0151bc15:
              if (0xfffffffffffffffd < (string_size - uVar9) - 3) {
                local_58._10_4_ = uVar2;
                DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_58);
              }
              break;
            }
          }
          else if ((bVar1 == 0x62) || (bVar1 == 0x78)) goto LAB_0151bc15;
        }
        uVar6 = string_size - uVar9;
        local_40 = (ulong)(bVar15 == 0x2b);
        local_58.result = 0;
        uVar4 = local_40;
        goto LAB_0151bc69;
      }
      uVar9 = uVar9 + 1;
    } while (string_size != uVar9);
  }
  goto LAB_0151c0c8;
LAB_0151b9ed:
  do {
    if (uVar6 <= uVar4) {
      local_58._11_3_ = 0;
      goto LAB_0151baf1;
    }
    bVar15 = string_ptr[uVar9 + uVar4] - 0x30;
    if (9 < bVar15) {
      local_58._11_3_ = 0;
      if (string_ptr[uVar9 + uVar4] != '.') goto LAB_0151be92;
      uVar5 = uVar4 + 1;
      iVar8 = 3;
      uVar7 = uVar5;
      if (uVar6 <= uVar5) goto LAB_0151be67;
      local_40 = local_40 & 0xffffffffffffff00;
      goto LAB_0151bb5f;
    }
    uVar5 = uVar4 + 1;
    if ((bVar15 == 0) && (local_58.result == 0)) {
LAB_0151ba1a:
      bVar17 = true;
      if ((~uVar4 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar4] == '_')) {
        uVar5 = uVar4 + 2;
        if ((string_size - uVar4) - 2 == uVar9) {
          bVar17 = false;
        }
        else {
          bVar17 = (byte)(string_ptr[uVar9 + uVar5] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_58.digit_count) &&
         (local_58.digit_count = local_58.digit_count + 1, -0xccccccccccccccd < local_58.result)) {
        local_58.result = local_58.result * 10 - (ulong)bVar15;
        goto LAB_0151ba1a;
      }
      bVar17 = false;
    }
    uVar4 = uVar5;
  } while (bVar17);
  goto LAB_0151c0c8;
  while (uVar7 = uVar16, uVar16 < uVar6) {
LAB_0151bb5f:
    bVar15 = string_ptr[uVar9 + uVar7] - 0x30;
    local_38 = uVar5;
    if (9 < bVar15) {
      iVar8 = 0;
      goto LAB_0151be49;
    }
    if ((bVar14 == scale) && (bVar3 == false)) {
      local_40 = CONCAT71(local_40._1_7_,4 < bVar15);
      bVar3 = true;
    }
    if ((uint)bVar14 + (uint)local_58.digit_count < 0x12) {
      bVar14 = bVar14 + 1;
      local_58.result = local_58.result * 10 - (ulong)bVar15;
    }
    uVar16 = uVar7 + 1;
    if (((~uVar7 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar7] == '_')) &&
       ((uVar16 = uVar7 + 2, (string_size - uVar7) - 2 == uVar9 ||
        (9 < (byte)(string_ptr[uVar9 + uVar16] - 0x30U))))) {
      local_58.decimal_count = bVar14;
      local_58.round_set = bVar3;
      local_58.should_round = (bool)(undefined1)local_40;
      uVar7 = uVar16;
      iVar12 = 1;
      goto LAB_0151be7f;
    }
  }
  iVar8 = 3;
LAB_0151be49:
  local_58.decimal_count = bVar14;
  local_58.round_set = bVar3;
  local_58.should_round = (bool)(undefined1)local_40;
LAB_0151be67:
  iVar12 = 1;
  if (uVar5 < uVar7) {
    iVar12 = iVar8;
  }
  if (1 < uVar4) {
    iVar12 = iVar8;
  }
LAB_0151be7f:
  uVar4 = uVar7;
  if (iVar12 != 3) {
    if (iVar12 != 0) goto LAB_0151c0c8;
LAB_0151be92:
    bVar15 = string_ptr[uVar9 + uVar4];
    bVar3 = false;
    uVar13 = (uint)bVar15;
    if (bVar15 < 0x20) {
      if (4 < uVar13 - 9) goto LAB_0151c0ca;
    }
    else {
      if ((bVar15 == 0x65) || (uVar13 == 0x45)) {
        if ((uVar4 != 1) && (uVar4 + 1 < uVar6)) {
          local_5c.result = 0;
          pcVar11 = string_ptr + uVar9 + uVar4 + 1;
          iVar10 = ~uVar9 + (string_size - uVar4);
          if (*pcVar11 == '-') {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar11,iVar10,&local_5c,SUB81(uVar6,0));
          }
          else {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar11,iVar10,&local_5c,SUB81(uVar6,0));
          }
          if (bVar3 != false) {
            bVar3 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,true>
                              (&local_58,(int)local_5c.result);
            goto LAB_0151c0ca;
          }
        }
        goto LAB_0151c0c8;
      }
      if (uVar13 != 0x20) goto LAB_0151c0ca;
    }
    uVar5 = uVar4 + 1;
    uVar4 = uVar5;
    if (uVar5 < uVar6) {
      do {
        if ((4 < (byte)string_ptr[uVar9 + uVar5] - 9) && (string_ptr[uVar9 + uVar5] != 0x20))
        goto LAB_0151c0c8;
        uVar5 = uVar5 + 1;
        uVar4 = uVar6;
      } while (uVar6 != uVar5);
    }
  }
LAB_0151baf1:
  bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,true>(&local_58);
  if (bVar3) {
    bVar3 = 1 < uVar4;
    goto LAB_0151c0ca;
  }
  goto LAB_0151c0c8;
LAB_0151bc69:
  do {
    if (uVar6 <= uVar4) {
      local_58._11_3_ = 0;
      goto LAB_0151bd29;
    }
    bVar15 = string_ptr[uVar9 + uVar4] - 0x30;
    if (9 < bVar15) {
      local_58._11_3_ = 0;
      if (string_ptr[uVar9 + uVar4] != '.') goto LAB_0151bf95;
      uVar5 = uVar4 + 1;
      iVar8 = 3;
      uVar7 = uVar5;
      if (uVar6 <= uVar5) goto LAB_0151bf69;
      local_38 = local_38 & 0xffffffffffffff00;
      local_59 = false;
      goto LAB_0151bd94;
    }
    uVar5 = uVar4 + 1;
    if ((bVar15 == 0) && (local_58.result == 0)) {
LAB_0151bc97:
      bVar3 = true;
      if ((~uVar4 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar4] == '_')) {
        uVar5 = uVar4 + 2;
        if ((string_size - uVar4) - 2 == uVar9) {
          bVar3 = false;
        }
        else {
          bVar3 = (byte)(string_ptr[uVar9 + uVar5] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_58.digit_count) &&
         (local_58.digit_count = local_58.digit_count + 1, local_58.result < 0xccccccccccccccd)) {
        local_58.result = (ulong)bVar15 + local_58.result * 10;
        goto LAB_0151bc97;
      }
      bVar3 = false;
    }
    uVar4 = uVar5;
  } while (bVar3);
  goto LAB_0151c0c8;
  while (uVar7 = uVar16, uVar16 < uVar6) {
LAB_0151bd94:
    bVar15 = string_ptr[uVar9 + uVar7] - 0x30;
    if (9 < bVar15) {
      iVar8 = 0;
      goto LAB_0151bf4b;
    }
    if ((bVar14 == scale) && ((char)local_38 == '\0')) {
      local_59 = 4 < bVar15;
      local_38 = CONCAT71(local_38._1_7_,1);
    }
    if ((uint)bVar14 + (uint)local_58.digit_count < 0x12) {
      bVar14 = bVar14 + 1;
      local_58.result = (ulong)bVar15 + local_58.result * 10;
    }
    uVar16 = uVar7 + 1;
    if (((~uVar7 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar7] == '_')) &&
       ((uVar16 = uVar7 + 2, (string_size - uVar7) - 2 == uVar9 ||
        (9 < (byte)(string_ptr[uVar9 + uVar16] - 0x30U))))) {
      local_58.decimal_count = bVar14;
      local_58.round_set = (bool)(char)local_38;
      local_58.should_round = local_59;
      uVar7 = uVar16;
      iVar12 = 1;
      goto LAB_0151bf82;
    }
  }
  iVar8 = 3;
LAB_0151bf4b:
  local_58.decimal_count = bVar14;
  local_58.round_set = (bool)(char)local_38;
  local_58.should_round = local_59;
LAB_0151bf69:
  iVar12 = 1;
  if (uVar5 < uVar7) {
    iVar12 = iVar8;
  }
  if (local_40 < uVar4) {
    iVar12 = iVar8;
  }
LAB_0151bf82:
  uVar4 = uVar7;
  if (iVar12 != 3) {
    if (iVar12 != 0) goto LAB_0151c0c8;
LAB_0151bf95:
    pcVar11 = string_ptr + uVar4;
    bVar15 = pcVar11[uVar9];
    bVar3 = false;
    uVar13 = (uint)bVar15;
    if (bVar15 < 0x20) {
      if (4 < uVar13 - 9) goto LAB_0151c0ca;
    }
    else {
      if ((bVar15 == 0x65) || (uVar13 == 0x45)) {
        if ((uVar4 != local_40) && (uVar4 + 1 < uVar6)) {
          local_5c.result = 0;
          buf = pcVar11 + uVar9 + 1;
          iVar10 = ~uVar9 + (string_size - uVar4);
          if (*buf == '-') {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (buf,iVar10,&local_5c,SUB81(pcVar11,0));
          }
          else {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (buf,iVar10,&local_5c,SUB81(pcVar11,0));
          }
          if (bVar3 != false) {
            bVar3 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,false>
                              (&local_58,(int)local_5c.result);
            goto LAB_0151c0ca;
          }
        }
        goto LAB_0151c0c8;
      }
      if (uVar13 != 0x20) goto LAB_0151c0ca;
    }
    uVar5 = uVar4 + 1;
    uVar4 = uVar5;
    if (uVar5 < uVar6) {
      do {
        if ((4 < (byte)string_ptr[uVar9 + uVar5] - 9) && (string_ptr[uVar9 + uVar5] != 0x20))
        goto LAB_0151c0c8;
        uVar5 = uVar5 + 1;
        uVar4 = uVar6;
      } while (uVar6 != uVar5);
    }
  }
LAB_0151bd29:
  bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_58);
  if (bVar3) {
    bVar3 = local_40 < uVar4;
    goto LAB_0151c0ca;
  }
LAB_0151c0c8:
  bVar3 = false;
LAB_0151c0ca:
  if (bVar3 != false) {
    *result = local_58.result;
  }
  return bVar3;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}